

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O1

bool __thiscall S2BooleanOperation::Impl::AreRegionsIdentical(Impl *this)

{
  double *pdVar1;
  double dVar2;
  S2ShapeIndex *pSVar3;
  S2ShapeIndex *pSVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  long *plVar11;
  long lVar12;
  undefined8 uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  bool bVar17;
  int iVar18;
  ReferencePoint a_ref;
  ReferencePoint b_ref;
  S2LogMessage local_90;
  char local_78;
  undefined7 uStack_77;
  double adStack_70 [5];
  char local_48;
  undefined7 uStack_47;
  double adStack_40 [2];
  long *plVar10;
  undefined4 extraout_var_00;
  
  pSVar3 = this->op_->regions_[0];
  pSVar4 = this->op_->regions_[1];
  if (pSVar3 == pSVar4) {
    bVar17 = true;
  }
  else {
    uVar6 = (*pSVar3->_vptr_S2ShapeIndex[2])(pSVar3);
    uVar7 = (*pSVar4->_vptr_S2ShapeIndex[2])(pSVar4);
    if (uVar6 == uVar7) {
      bVar17 = (int)uVar6 < 1;
      if (0 < (int)uVar6) {
        uVar16 = 0;
        while( true ) {
          iVar8 = (*pSVar3->_vptr_S2ShapeIndex[3])(pSVar3,uVar16);
          plVar10 = (long *)CONCAT44(extraout_var,iVar8);
          iVar8 = (*pSVar4->_vptr_S2ShapeIndex[3])(pSVar4,uVar16);
          plVar11 = (long *)CONCAT44(extraout_var_00,iVar8);
          iVar8 = (**(code **)(*plVar10 + 0x20))(plVar10);
          iVar9 = (**(code **)(*plVar11 + 0x20))(plVar11);
          if (iVar8 != iVar9) break;
          iVar8 = (**(code **)(*plVar10 + 0x20))(plVar10);
          if (iVar8 == 2) {
            (**(code **)(*plVar10 + 0x28))(&local_90,plVar10);
            (**(code **)(*plVar11 + 0x28))(adStack_70 + 2,plVar11);
            if ((double)local_90._0_8_ != adStack_70[2]) {
              return bVar17;
            }
            if (NAN((double)local_90._0_8_) || NAN(adStack_70[2])) {
              return bVar17;
            }
            lVar12 = 8;
            while (lVar12 != 0x18) {
              dVar2 = *(double *)((long)&local_90.severity_ + lVar12);
              pdVar1 = (double *)((long)adStack_70 + lVar12 + 0x10);
              lVar12 = lVar12 + 8;
              if (dVar2 != *pdVar1) {
                return bVar17;
              }
              if (NAN(dVar2) || NAN(*pdVar1)) {
                return bVar17;
              }
            }
            if (local_78 != local_48) {
              return bVar17;
            }
          }
          iVar8 = (**(code **)(*plVar10 + 0x30))(plVar10);
          iVar9 = (**(code **)(*plVar11 + 0x30))(plVar11);
          if (iVar8 != iVar9) {
            return bVar17;
          }
          if (0 < iVar8) {
            iVar9 = 0;
            do {
              lVar12 = (**(code **)(*plVar10 + 0x38))(plVar10,iVar9);
              uVar13 = (**(code **)(*plVar11 + 0x38))(plVar11,iVar9);
              if ((int)lVar12 != (int)uVar13) {
                S2LogMessage::S2LogMessage
                          (&local_90,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                           ,0x8a8,kFatal,(ostream *)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>
                          (local_90.stream_,"Check failed: (a_chain.start) == (b_chain.start) ",0x31
                          );
                abort();
              }
              iVar14 = 1;
              iVar18 = (int)((ulong)lVar12 >> 0x20);
              bVar5 = false;
              if (iVar18 == (int)((ulong)uVar13 >> 0x20)) {
                bVar5 = true;
                if (iVar18 == 0 || lVar12 < 0) {
                  iVar14 = 0;
                  bVar5 = true;
                }
                else {
                  iVar15 = 0;
                  do {
                    (**(code **)(*plVar10 + 0x40))(&local_90,plVar10,iVar9,iVar15);
                    (**(code **)(*plVar11 + 0x40))(adStack_70 + 2,plVar11,iVar9,iVar15);
                    if (((double)local_90._0_8_ != adStack_70[2]) ||
                       (NAN((double)local_90._0_8_) || NAN(adStack_70[2]))) {
LAB_001a1e61:
                      iVar14 = 1;
                      bVar5 = false;
                      goto LAB_001a1e7a;
                    }
                    lVar12 = 8;
                    while (lVar12 != 0x18) {
                      dVar2 = *(double *)((long)&local_90.severity_ + lVar12);
                      pdVar1 = (double *)((long)adStack_70 + lVar12 + 0x10);
                      lVar12 = lVar12 + 8;
                      if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) goto LAB_001a1e61;
                    }
                    iVar14 = 1;
                    if (((double)CONCAT71(uStack_77,local_78) !=
                         (double)CONCAT71(uStack_47,local_48)) ||
                       (NAN((double)CONCAT71(uStack_77,local_78)) ||
                        NAN((double)CONCAT71(uStack_47,local_48)))) {
LAB_001a1e73:
                      bVar5 = false;
                      goto LAB_001a1e7a;
                    }
                    lVar12 = 0x20;
                    while (lVar12 != 0x30) {
                      dVar2 = *(double *)((long)&local_90.severity_ + lVar12);
                      pdVar1 = (double *)((long)adStack_70 + lVar12 + 0x10);
                      lVar12 = lVar12 + 8;
                      if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) goto LAB_001a1e73;
                    }
                    iVar15 = iVar15 + 1;
                  } while (iVar15 != iVar18);
                  iVar14 = 0;
                }
              }
LAB_001a1e7a:
              if (!bVar5) goto LAB_001a1e90;
              iVar9 = iVar9 + 1;
            } while (iVar9 != iVar8);
          }
          iVar14 = 5;
LAB_001a1e90:
          if ((iVar14 != 0) && (iVar14 != 5)) {
            return bVar17;
          }
          uVar7 = (int)uVar16 + 1;
          uVar16 = (ulong)uVar7;
          bVar17 = (int)uVar6 <= (int)uVar7;
          if (uVar7 == uVar6) {
            return bVar17;
          }
        }
      }
    }
    else {
      bVar17 = false;
    }
  }
  return bVar17;
}

Assistant:

bool S2BooleanOperation::Impl::AreRegionsIdentical() const {
  const S2ShapeIndex* a = op_->regions_[0];
  const S2ShapeIndex* b = op_->regions_[1];
  if (a == b) return true;
  int num_shape_ids = a->num_shape_ids();
  if (num_shape_ids != b->num_shape_ids()) return false;
  for (int s = 0; s < num_shape_ids; ++s) {
    const S2Shape* a_shape = a->shape(s);
    const S2Shape* b_shape = b->shape(s);
    if (a_shape->dimension() != b_shape->dimension()) return false;
    if (a_shape->dimension() == 2) {
      auto a_ref = a_shape->GetReferencePoint();
      auto b_ref = b_shape->GetReferencePoint();
      if (a_ref.point != b_ref.point) return false;
      if (a_ref.contained != b_ref.contained) return false;
    }
    int num_chains = a_shape->num_chains();
    if (num_chains != b_shape->num_chains()) return false;
    for (int c = 0; c < num_chains; ++c) {
      S2Shape::Chain a_chain = a_shape->chain(c);
      S2Shape::Chain b_chain = b_shape->chain(c);
      S2_DCHECK_EQ(a_chain.start, b_chain.start);
      if (a_chain.length != b_chain.length) return false;
      for (int i = 0; i < a_chain.length; ++i) {
        S2Shape::Edge a_edge = a_shape->chain_edge(c, i);
        S2Shape::Edge b_edge = b_shape->chain_edge(c, i);
        if (a_edge.v0 != b_edge.v0) return false;
        if (a_edge.v1 != b_edge.v1) return false;
      }
    }
  }
  return true;
}